

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::CommonFunctionCase::init(CommonFunctionCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint uVar2;
  RenderContext *pRVar3;
  ShaderExecutor *pSVar4;
  TestLog *log;
  TestError *this_00;
  GLSLVersion GVar5;
  allocator<char> local_39;
  string local_38;
  deUint32 local_18;
  ContextType local_14;
  CommonFunctionCase *local_10;
  CommonFunctionCase *this_local;
  
  local_10 = this;
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  local_14.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  local_18 = (deUint32)glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(local_14,(ApiType)local_18);
  GVar5 = GLSL_VERSION_310_ES;
  if (bVar1) {
    GVar5 = GLSL_VERSION_320_ES;
  }
  (this->m_spec).version = GVar5;
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  pSVar4 = deqp::gls::ShaderExecUtil::createExecutor(pRVar3,this->m_shaderType,&this->m_spec);
  this->m_executor = pSVar4;
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  deqp::gls::ShaderExecUtil::operator<<(log,this->m_executor);
  uVar2 = (*this->m_executor->_vptr_ShaderExecutor[2])();
  if ((uVar2 & 1) == 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Compile failed",&local_39);
    tcu::TestError::TestError(this_00,&local_38);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return uVar2;
}

Assistant:

void CommonFunctionCase::init (void)
{
	DE_ASSERT(!m_executor);

	m_spec.version = contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) ? glu::GLSL_VERSION_320_ES : glu::GLSL_VERSION_310_ES;

	m_executor = createExecutor(m_context.getRenderContext(), m_shaderType, m_spec);
	m_testCtx.getLog() << m_executor;

	if (!m_executor->isOk())
		throw tcu::TestError("Compile failed");
}